

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O3

iterator * __thiscall
skiplist<int,_std::less<int>_>::find
          (iterator *__return_storage_ptr__,skiplist<int,_std::less<int>_> *this,int value)

{
  pointer ppSVar1;
  int iVar2;
  SLNode<int> *pSVar3;
  SLNode<int> *pSVar4;
  
  ppSVar1 = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppSVar1) {
    pSVar3 = ppSVar1[-1];
    while (pSVar3->down != (SLNode<int> *)0x0) {
      do {
        pSVar4 = pSVar3;
        pSVar3 = pSVar4->next;
        if (pSVar3 == (SLNode<int> *)0x0) break;
      } while (pSVar3->val < value);
      pSVar3 = pSVar4->down;
    }
    do {
      pSVar3 = pSVar3->next;
      if (pSVar3 == (SLNode<int> *)0x0) goto LAB_00102ed6;
    } while (pSVar3->val < value);
    if (pSVar3->val == value) {
      __return_storage_ptr__->node = pSVar3;
      iVar2 = pSVar3->count + -1;
      __return_storage_ptr__->node_count_ = iVar2;
      __return_storage_ptr__->node_count_ref_ = iVar2;
      goto LAB_00102edf;
    }
  }
LAB_00102ed6:
  __return_storage_ptr__->node = (SLNode<int> *)0x0;
  __return_storage_ptr__->node_count_ = 0;
  __return_storage_ptr__->node_count_ref_ = 0;
LAB_00102edf:
  __return_storage_ptr__->reverse_ = false;
  return __return_storage_ptr__;
}

Assistant:

typename skiplist<T, X>::iterator skiplist<T, X>::find(T value) {
    // Same algorithm as erase, but without erasing anything ;)
    if(key.empty())
        return end();

    // Start from top left
    SLNode<T>* follow = key.back();
    // Go on till level 0
    while(follow->down) {
        while(follow->next && compare(follow->next->val, value))
            follow = follow->next;
        follow = follow->down;
    }
    // Traverse at level 0 till dest reached
    while(follow->next && compare(follow->next->val, value))
        follow = follow->next;

    // If not exist, leave
    if(!follow->next || !_420_is_equal(follow->next->val, value, compare))
        return end();

    // This is the node for sure
    follow = follow->next;
    return iterator(follow);
}